

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testoverlay.c
# Opt level: O2

int main(int argc,char **argv)

{
  Uint32 UVar1;
  int iVar2;
  int iVar3;
  int extraout_EAX;
  undefined8 uVar4;
  SDL_Surface *pSVar5;
  char *pcVar6;
  FILE *pFVar7;
  char *pcVar8;
  char **ppcVar9;
  ulong uVar10;
  size_t sStack_90;
  undefined4 local_80;
  uint local_7c;
  char *local_78;
  uint local_70;
  int local_6c;
  undefined8 local_60;
  undefined2 local_58;
  undefined8 local_56;
  undefined4 local_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 local_3c;
  undefined1 local_38;
  
  pcVar8 = *argv;
  scale = 0;
  monochrome = 0;
  luminance = 100;
  w = 0x280;
  h = 0x1e0;
  local_80 = 0x32315659;
  local_70 = 0;
  local_6c = 1;
  local_78 = "YV12";
  local_7c = 0;
LAB_001019c1:
  if (argc < 2) goto LAB_00101ca0;
  pcVar6 = argv[1];
  iVar2 = strcmp(pcVar6,"-delay");
  iVar3 = -2;
  if (iVar2 == 0) {
    if (argv[2] == (char *)0x0) {
      pcVar8 = "The -delay option requires an argument\n";
LAB_00102045:
      sStack_90 = 0x27;
LAB_00102088:
      fwrite(pcVar8,sStack_90,1,_stderr);
      return 1;
    }
    local_6c = atoi(argv[2]);
  }
  else {
    iVar2 = strcmp(pcVar6,"-width");
    if (iVar2 == 0) {
      if ((argv[2] == (char *)0x0) || (w = atoi(argv[2]), w < 1)) {
        pcVar8 = "The -width option requires an argument\n";
        goto LAB_00102045;
      }
      goto LAB_00101b6c;
    }
    iVar2 = strcmp(pcVar6,"-height");
    if (iVar2 == 0) {
      if ((argv[2] == (char *)0x0) || (h = atoi(argv[2]), h < 1)) {
        pcVar8 = "The -height option requires an argument\n";
LAB_0010205a:
        sStack_90 = 0x28;
        goto LAB_00102088;
      }
      goto LAB_00101b6c;
    }
    iVar2 = strcmp(pcVar6,"-bpp");
    if (iVar2 == 0) {
      if (argv[2] == (char *)0x0) {
        pcVar8 = "The -bpp option requires an argument\n";
LAB_00102082:
        sStack_90 = 0x25;
        goto LAB_00102088;
      }
      local_70 = atoi(argv[2]);
      goto LAB_00101b6c;
    }
    iVar2 = strcmp(pcVar6,"-lum");
    if (iVar2 == 0) {
      if (argv[2] == (char *)0x0) {
        pcVar8 = "The -lum option requires an argument\n";
        goto LAB_00102082;
      }
      luminance = atoi(argv[2]);
      goto LAB_00101b6c;
    }
    iVar2 = strcmp(pcVar6,"-format");
    if (iVar2 != 0) {
      ppcVar9 = argv + 1;
      iVar2 = strcmp(pcVar6,"-hw");
      if (iVar2 == 0) {
        local_7c = local_7c | 1;
      }
      else {
        iVar2 = strcmp(pcVar6,"-flip");
        if (iVar2 == 0) {
          local_7c = local_7c | 0x40000000;
        }
        else {
          iVar2 = strcmp(pcVar6,"-scale");
          if (iVar2 == 0) {
            scale = 1;
          }
          else {
            iVar2 = strcmp(pcVar6,"-mono");
            if (iVar2 == 0) {
              monochrome = 1;
            }
            else {
              iVar2 = strcmp(pcVar6,"-help");
              if ((iVar2 == 0) || (((*pcVar6 == '-' && (pcVar6[1] == 'h')) && (pcVar6[2] == '\0'))))
              {
                fprintf(_stderr,"Usage: %s [arg] [arg] [arg] ...\n",pcVar8);
                fwrite("Where \'arg\' is one of:\n",0x17,1,_stderr);
                fwrite("\t-delay <seconds>\n",0x12,1,_stderr);
                fwrite("\t-width <pixels>\n",0x11,1,_stderr);
                fwrite("\t-height <pixels>\n",0x12,1,_stderr);
                fwrite("\t-bpp <bits>\n",0xd,1,_stderr);
                fwrite("\t-format <fmt> (one of the: YV12, IYUV, YUY2, UYVY, YVYU)\n",0x3a,1,_stderr
                      );
                fwrite("\t-hw\n",5,1,_stderr);
                fwrite("\t-flip\n",7,1,_stderr);
                fprintf(_stderr,"\t-scale (test scaling features, from 50%% upto window size)\n");
                fwrite("\t-mono (use monochromatic RGB2YUV conversion)\n",0x2e,1,_stderr);
                fwrite("\t-lum <perc> (use luminance correction during RGB2YUV conversion,\n",0x42,1
                       ,_stderr);
                fprintf(_stderr,"\t             from 0%% to unlimited, normal is 100%%)\n");
                fwrite("\t-help (shows this help)\n",0x19,1,_stderr);
                pcVar8 = "\t-fullscreen (test overlay in fullscreen mode)\n";
                sStack_90 = 0x2f;
                goto LAB_00102088;
              }
              iVar2 = strcmp(pcVar6,"-fullscreen");
              if (iVar2 != 0) goto LAB_00101ca0;
              local_7c = local_7c | 0x80000000;
            }
          }
        }
      }
      iVar3 = -1;
      goto LAB_00101b6e;
    }
    pcVar6 = argv[2];
    if (pcVar6 == (char *)0x0) {
      pcVar8 = "The -format option requires an argument\n";
      goto LAB_0010205a;
    }
    ppcVar9 = argv + 2;
    iVar2 = strcmp(pcVar6,"YV12");
    if (iVar2 == 0) {
      local_80 = 0x32315659;
    }
    else {
      iVar2 = strcmp(pcVar6,"IYUV");
      if (iVar2 == 0) {
        local_80 = 0x56555949;
      }
      else {
        iVar2 = strcmp(pcVar6,"YUY2");
        if (iVar2 != 0) {
          iVar2 = strcmp(pcVar6,"UYVY");
          if (iVar2 == 0) {
            local_80 = 0x59565955;
            goto LAB_00101b6c;
          }
          iVar2 = strcmp(pcVar6,"YVYU");
          local_80 = 0x55595659;
          if (iVar2 == 0) goto LAB_00101b6e;
          pcVar8 = "The -format option %s is not recognized\n";
          pFVar7 = _stderr;
          goto LAB_00102018;
        }
        local_80 = 0x32595559;
      }
    }
  }
LAB_00101b6c:
  ppcVar9 = argv + 2;
LAB_00101b6e:
  argc = argc + iVar3;
  argv = ppcVar9;
  goto LAB_001019c1;
LAB_00101ca0:
  iVar2 = SDL_Init(0x20);
  pFVar7 = _stderr;
  if (iVar2 < 0) {
    pcVar6 = (char *)SDL_GetError();
    pcVar8 = "Couldn\'t initialize SDL: %s\n";
LAB_00102018:
    fprintf(pFVar7,pcVar8,pcVar6);
    return 1;
  }
  screen = (SDL_Surface *)SDL_SetVideoMode(w,h,local_70,local_7c);
  pFVar7 = _stderr;
  iVar2 = w;
  if (screen == (SDL_Surface *)0x0) {
    pcVar8 = (char *)(ulong)(uint)h;
    uVar4 = SDL_GetError();
    fprintf(pFVar7,"Couldn\'t set %dx%dx%d video mode: %s\n",(ulong)(uint)iVar2,pcVar8,
            (ulong)local_70,uVar4);
    quit((int)pFVar7);
LAB_00102240:
    pFVar7 = _stderr;
    uVar4 = SDL_GetError();
    fprintf(pFVar7,"Couldn\'t load %s: %s\n",pcVar8,uVar4);
    quit((int)pFVar7);
LAB_0010226b:
    pFVar7 = _stderr;
    uVar4 = SDL_GetError();
    pcVar8 = "Couldn\'t convert picture to 32bits RGB: %s\n";
  }
  else {
    pcVar8 = " fullscreen";
    if (-1 < (int)screen->flags) {
      pcVar8 = "";
    }
    printf("Set%s %dx%dx%d mode\n",pcVar8,(ulong)(uint)screen->w,(ulong)(uint)screen->h,
           (ulong)screen->format->BitsPerPixel);
    pcVar8 = "video";
    if ((screen->flags & 1) == 0) {
      pcVar8 = "system";
    }
    printf("(video surface located in %s memory)\n",pcVar8);
    if ((screen->flags & 0x40000000) != 0) {
      puts("Double-buffering enabled");
    }
    SDL_WM_SetCaption("SDL test overlay","testoverlay");
    pcVar8 = "sample.bmp";
    if (argv[1] != (char *)0x0) {
      pcVar8 = argv[1];
    }
    uVar4 = SDL_RWFromFile(pcVar8,"rb");
    pic = (SDL_Surface *)SDL_LoadBMP_RW(uVar4,1);
    if (pic == (SDL_Surface *)0x0) goto LAB_00102240;
    local_60 = 0;
    local_58 = 0x420;
    local_4c = 0xff;
    uStack_48 = 0xff00;
    uStack_44 = 0xff0000;
    uStack_40 = 0;
    local_56 = 0x10080008000000;
    local_3c = 0;
    local_38 = 0;
    pSVar5 = (SDL_Surface *)SDL_ConvertSurface(pic,&local_60,0);
    if (pSVar5 == (SDL_Surface *)0x0) goto LAB_0010226b;
    SDL_FreeSurface(pic);
    pic = pSVar5;
    overlay = (SDL_Overlay *)SDL_CreateYUVOverlay(pSVar5->w,pSVar5->h,local_80,screen);
    pFVar7 = _stderr;
    if (overlay != (SDL_Overlay *)0x0) {
      UVar1 = overlay->format;
      pcVar8 = "hardware";
      if ((overlay->field_0x30 & 1) == 0) {
        pcVar8 = "software";
      }
      if (UVar1 != 0x32315659) {
        if (UVar1 == 0x32595559) {
          local_78 = "YUY2";
        }
        else if (UVar1 == 0x56555949) {
          local_78 = "IYUV";
        }
        else if (UVar1 == 0x59565955) {
          local_78 = "UYVY";
        }
        else {
          local_78 = "Unknown";
          if (UVar1 == 0x55595659) {
            local_78 = "YVYU";
          }
        }
      }
      printf("Created %dx%dx%d %s %s overlay\n",(ulong)(uint)overlay->w,(ulong)(uint)overlay->h,
             (ulong)(uint)overlay->planes,pcVar8,local_78);
      for (uVar10 = 0; (long)uVar10 < (long)overlay->planes; uVar10 = uVar10 + 1) {
        printf("  plane %d: pitch=%d\n",uVar10 & 0xffffffff,(ulong)overlay->pitches[uVar10]);
      }
      iVar2 = SDL_GetTicks();
      UVar1 = overlay->format;
      if (UVar1 == 0x59565955) {
        ConvertRGBtoUYVY(pic,overlay,monochrome,luminance);
LAB_00101f9b:
        iVar3 = SDL_GetTicks();
        printf("Conversion Time: %d milliseconds\n",(ulong)(uint)(iVar3 - iVar2));
        iVar2 = SDL_GetTicks();
        Draw();
        iVar3 = SDL_GetTicks();
        printf("Time: %d milliseconds\n",(ulong)(uint)(iVar3 - iVar2));
        SDL_Delay(local_6c * 1000);
        SDL_Quit();
        return 0;
      }
      if (UVar1 == 0x32595559) {
        ConvertRGBtoYUY2(pic,overlay,monochrome,luminance);
        goto LAB_00101f9b;
      }
      if (UVar1 == 0x55595659) {
        ConvertRGBtoYVYU(pic,overlay,monochrome,luminance);
        goto LAB_00101f9b;
      }
      if (UVar1 == 0x56555949) {
        ConvertRGBtoIYUV(pic,overlay,monochrome,luminance);
        goto LAB_00101f9b;
      }
      if (UVar1 == 0x32315659) {
        ConvertRGBtoYV12(pic,overlay,monochrome,luminance);
        goto LAB_00101f9b;
      }
      goto LAB_001022ab;
    }
    uVar4 = SDL_GetError();
    pcVar8 = "Couldn\'t create overlay: %s\n";
  }
  fprintf(pFVar7,pcVar8,uVar4);
  quit((int)pFVar7);
LAB_001022ab:
  iVar2 = 0x10359a;
  puts("cannot convert RGB picture to obtained YUV format!");
  quit(iVar2);
  return extraout_EAX;
}

Assistant:

int main(int argc, char **argv)
{
	char *argv0 = argv[0];
	int delay;
	int desired_bpp;
	Uint32 video_flags, overlay_format;
	const char *bmpfile;
#ifdef BENCHMARK_SDL
	Uint32 then, now;
#endif
	int i;

	/* Set default options and check command-line */
	scale=0;
        monochrome=0;
        luminance=100;
	delay = 1;
	w = WINDOW_WIDTH;
	h = WINDOW_HEIGHT;
	desired_bpp = 0;
	video_flags = 0;
	overlay_format = SDL_YV12_OVERLAY;

	while ( argc > 1 ) {
		if ( strcmp(argv[1], "-delay") == 0 ) {
			if ( argv[2] ) {
				delay = atoi(argv[2]);
				argv += 2;
				argc -= 2;
			} else {
				fprintf(stderr,
				"The -delay option requires an argument\n");
				return(1);
			}
		} else
		if ( strcmp(argv[1], "-width") == 0 ) {
			if ( argv[2] && ((w = atoi(argv[2])) > 0) ) {
				argv += 2;
				argc -= 2;
			} else {
				fprintf(stderr,
				"The -width option requires an argument\n");
				return(1);
			}
		} else
		if ( strcmp(argv[1], "-height") == 0 ) {
			if ( argv[2] && ((h = atoi(argv[2])) > 0) ) {
				argv += 2;
				argc -= 2;
			} else {
				fprintf(stderr,
				"The -height option requires an argument\n");
				return(1);
			}
		} else
		if ( strcmp(argv[1], "-bpp") == 0 ) {
			if ( argv[2] ) {
				desired_bpp = atoi(argv[2]);
				argv += 2;
				argc -= 2;
			} else {
				fprintf(stderr,
				"The -bpp option requires an argument\n");
				return(1);
			}
		} else
		if ( strcmp(argv[1], "-lum") == 0 ) {
			if ( argv[2] ) {
				luminance = atoi(argv[2]);
				argv += 2;
				argc -= 2;
			} else {
				fprintf(stderr,
				"The -lum option requires an argument\n");
				return(1);
			}
		} else
		if ( strcmp(argv[1], "-format") == 0 ) {
			if ( argv[2] ) {
				if(!strcmp(argv[2],"YV12"))
					overlay_format = SDL_YV12_OVERLAY;
				else if(!strcmp(argv[2],"IYUV"))
					overlay_format = SDL_IYUV_OVERLAY;
				else if(!strcmp(argv[2],"YUY2"))
					overlay_format = SDL_YUY2_OVERLAY;
				else if(!strcmp(argv[2],"UYVY"))
					overlay_format = SDL_UYVY_OVERLAY;
				else if(!strcmp(argv[2],"YVYU"))
					overlay_format = SDL_YVYU_OVERLAY;
				else
				{
					fprintf(stderr, "The -format option %s is not recognized\n",argv[2]);
					return(1);
				}
				argv += 2;
				argc -= 2;
			} else {
				fprintf(stderr,
				"The -format option requires an argument\n");
				return(1);
			}
		} else
		if ( strcmp(argv[1], "-hw") == 0 ) {
			video_flags |= SDL_HWSURFACE;
			argv += 1;
			argc -= 1;
		} else
		if ( strcmp(argv[1], "-flip") == 0 ) {
			video_flags |= SDL_DOUBLEBUF;
			argv += 1;
			argc -= 1;
		} else
		if ( strcmp(argv[1], "-scale") == 0 ) {
			scale = 1;
			argv += 1;
			argc -= 1;
		} else
		if ( strcmp(argv[1], "-mono") == 0 ) {
			monochrome = 1;
			argv += 1;
			argc -= 1;
		} else
		if (( strcmp(argv[1], "-help") == 0 ) || (strcmp(argv[1], "-h") == 0)) {
                        PrintUsage(argv0);
                        return(1);
		} else
		if ( strcmp(argv[1], "-fullscreen") == 0 ) {
			video_flags |= SDL_FULLSCREEN;
			argv += 1;
			argc -= 1;
		} else
			break;
	}
	if ( SDL_Init(SDL_INIT_VIDEO) < 0 ) {
		fprintf(stderr,
			"Couldn't initialize SDL: %s\n", SDL_GetError());
		return(1);
	}

	/* Initialize the display */
	screen = SDL_SetVideoMode(w, h, desired_bpp, video_flags);
	if ( screen == NULL ) {
		fprintf(stderr, "Couldn't set %dx%dx%d video mode: %s\n",
					w, h, desired_bpp, SDL_GetError());
		quit(1);
	}
	printf("Set%s %dx%dx%d mode\n",
			screen->flags & SDL_FULLSCREEN ? " fullscreen" : "",
			screen->w, screen->h, screen->format->BitsPerPixel);
	printf("(video surface located in %s memory)\n",
			(screen->flags&SDL_HWSURFACE) ? "video" : "system");
	if ( screen->flags & SDL_DOUBLEBUF ) {
		printf("Double-buffering enabled\n");
	}

	/* Set the window manager title bar */
	SDL_WM_SetCaption("SDL test overlay", "testoverlay");

	/* Load picture */
	bmpfile = argv[1] ? argv[1]:"sample.bmp";
	pic = SDL_LoadBMP(bmpfile);
	if ( pic == NULL ) {
		fprintf(stderr, "Couldn't load %s: %s\n", bmpfile,
							SDL_GetError());
		quit(1);
	}

	/* Convert the picture to 32bits, for easy conversion */
	{
		SDL_Surface *newsurf;
		SDL_PixelFormat format;

		format.palette=NULL;
		format.BitsPerPixel=32;
		format.BytesPerPixel=4;
#if SDL_BYTEORDER == SDL_LIL_ENDIAN
		format.Rshift=0;
		format.Gshift=8;
		format.Bshift=16;
#else
		format.Rshift=24;
		format.Gshift=16;
		format.Bshift=8;
#endif
		format.Ashift=0;
		format.Rmask=0xff<<format.Rshift;
		format.Gmask=0xff<<format.Gshift;
		format.Bmask=0xff<<format.Bshift;
		format.Amask=0;
		format.Rloss=0;
		format.Gloss=0;
		format.Bloss=0;
		format.Aloss=8;
		format.colorkey=0;
		format.alpha=0;

		newsurf=SDL_ConvertSurface(pic, &format, SDL_SWSURFACE);
		if(!newsurf)
		{
			fprintf(stderr, "Couldn't convert picture to 32bits RGB: %s\n",
							SDL_GetError());
			quit(1);
		}
		SDL_FreeSurface(pic);
		pic=newsurf;
	}
	
	/* Create the overlay */
	overlay = SDL_CreateYUVOverlay(pic->w, pic->h, overlay_format, screen);
	if ( overlay == NULL ) {
		fprintf(stderr, "Couldn't create overlay: %s\n", SDL_GetError());
		quit(1);
	}
	printf("Created %dx%dx%d %s %s overlay\n",overlay->w,overlay->h,overlay->planes,
			overlay->hw_overlay?"hardware":"software",
			overlay->format==SDL_YV12_OVERLAY?"YV12":
			overlay->format==SDL_IYUV_OVERLAY?"IYUV":
			overlay->format==SDL_YUY2_OVERLAY?"YUY2":
			overlay->format==SDL_UYVY_OVERLAY?"UYVY":
			overlay->format==SDL_YVYU_OVERLAY?"YVYU":
			"Unknown");
	for(i=0; i<overlay->planes; i++)
	{
		printf("  plane %d: pitch=%d\n", i, overlay->pitches[i]);
	}
	
	/* Convert to YUV, and draw to the overlay */
#ifdef BENCHMARK_SDL
	then = SDL_GetTicks();
#endif
	switch(overlay->format)
	{
		case SDL_YV12_OVERLAY:
			ConvertRGBtoYV12(pic,overlay,monochrome,luminance);
			break;
		case SDL_UYVY_OVERLAY:
			ConvertRGBtoUYVY(pic,overlay,monochrome,luminance);
			break;
		case SDL_YVYU_OVERLAY:
			ConvertRGBtoYVYU(pic,overlay,monochrome,luminance);
			break;
		case SDL_YUY2_OVERLAY:
			ConvertRGBtoYUY2(pic,overlay,monochrome,luminance);
			break;
		case SDL_IYUV_OVERLAY:
			ConvertRGBtoIYUV(pic,overlay,monochrome,luminance);
			break;
		default:
			printf("cannot convert RGB picture to obtained YUV format!\n");
			quit(1);
			break;
	}
#ifdef BENCHMARK_SDL
	now = SDL_GetTicks();
	printf("Conversion Time: %d milliseconds\n", now-then);
#endif
	
	/* Do all the drawing work */
#ifdef BENCHMARK_SDL
	then = SDL_GetTicks();
#endif
	Draw();
#ifdef BENCHMARK_SDL
	now = SDL_GetTicks();
	printf("Time: %d milliseconds\n", now-then);
#endif
	SDL_Delay(delay*1000);
	SDL_Quit();
	return(0);
}